

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

char * Curl_all_content_encodings(void)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *local_38;
  char *p;
  char *ace;
  content_encoding *ce;
  content_encoding **cep;
  size_t len;
  
  cep = (content_encoding **)0x0;
  for (ce = (content_encoding *)encodings; ce->name != (char *)0x0;
      ce = (content_encoding *)&ce->alias) {
    pcVar3 = ce->name;
    iVar1 = Curl_strcasecompare(*(char **)pcVar3,"identity");
    if (iVar1 == 0) {
      sVar2 = strlen(*(char **)pcVar3);
      cep = (content_encoding **)(sVar2 + 2 + (long)cep);
    }
  }
  if (cep == (content_encoding **)0x0) {
    len = (size_t)(*Curl_cstrdup)("identity");
  }
  else {
    len = (size_t)(*Curl_cmalloc)((size_t)cep);
    if ((char *)len != (char *)0x0) {
      local_38 = (char *)len;
      for (ce = (content_encoding *)encodings; ce->name != (char *)0x0;
          ce = (content_encoding *)&ce->alias) {
        pcVar3 = ce->name;
        iVar1 = Curl_strcasecompare(*(char **)pcVar3,"identity");
        if (iVar1 == 0) {
          strcpy(local_38,*(char **)pcVar3);
          sVar2 = strlen(local_38);
          pcVar3 = local_38 + sVar2;
          *pcVar3 = ',';
          local_38 = pcVar3 + 2;
          pcVar3[1] = ' ';
        }
      }
      local_38[-2] = '\0';
    }
  }
  return (char *)len;
}

Assistant:

char *Curl_all_content_encodings(void)
{
  size_t len = 0;
  const content_encoding * const *cep;
  const content_encoding *ce;
  char *ace;

  for(cep = encodings; *cep; cep++) {
    ce = *cep;
    if(!strcasecompare(ce->name, CONTENT_ENCODING_DEFAULT))
      len += strlen(ce->name) + 2;
  }

  if(!len)
    return strdup(CONTENT_ENCODING_DEFAULT);

  ace = malloc(len);
  if(ace) {
    char *p = ace;
    for(cep = encodings; *cep; cep++) {
      ce = *cep;
      if(!strcasecompare(ce->name, CONTENT_ENCODING_DEFAULT)) {
        strcpy(p, ce->name);
        p += strlen(p);
        *p++ = ',';
        *p++ = ' ';
      }
    }
    p[-2] = '\0';
  }

  return ace;
}